

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O0

void __thiscall EOClient::Execute(EOClient *this,string *data)

{
  World *pWVar1;
  bool bVar2;
  PacketAction PVar3;
  PacketFamily PVar4;
  byte bVar5;
  unsigned_short uVar6;
  ulong uVar7;
  EOServer *pEVar8;
  mapped_type *pmVar9;
  undefined8 uVar10;
  bool local_177;
  bool local_133;
  byte local_132;
  IPAddress local_120;
  IPAddress local_11c;
  string local_118;
  allocator<char> local_f1;
  key_type local_f0;
  uint local_d0;
  uint local_cc;
  int server_seq;
  int client_seq;
  undefined1 local_c0 [3];
  bool ping_reply;
  undefined4 local_9c;
  IPAddress local_98;
  byte local_93;
  byte local_92;
  allocator<char> local_91;
  key_type local_90;
  PacketFamily local_6d;
  PacketFamily family;
  string local_60;
  undefined1 local_40 [8];
  PacketReader reader;
  string *data_local;
  EOClient *this_local;
  
  reader.pos = (size_t)data;
  uVar7 = std::__cxx11::string::length();
  if (uVar7 < 2) {
    return;
  }
  bVar2 = Client::Connected(&this->super_Client);
  if (!bVar2) {
    return;
  }
  PacketProcessor::Decode(&local_60,&this->processor,(string *)reader.pos);
  PacketReader::PacketReader((PacketReader *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (((this->super_Client).accepted & 1U) == 0) {
    local_6d = PacketReader::Family((PacketReader *)local_40);
    local_92 = 0;
    local_93 = 0;
    local_132 = 0;
    if ((local_6d != PACKET_F_INIT) && (local_132 = 0, local_6d != PACKET_CONNECTION)) {
      local_133 = false;
      if (local_6d == PACKET_PLAYERS) {
        PVar3 = PacketReader::Action((PacketReader *)local_40);
        local_133 = false;
        if (PVar3 == PACKET_LIST) {
          pEVar8 = server(this);
          pWVar1 = pEVar8->world;
          std::allocator<char>::allocator();
          local_92 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"AllowStats",&local_91);
          local_93 = 1;
          pmVar9 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                   ::operator[](&(pWVar1->config).
                                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                ,&local_90);
          local_133 = util::variant::operator_cast_to_bool(pmVar9);
        }
      }
      local_132 = local_133 ^ 0xff;
    }
    if ((local_93 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_90);
    }
    if ((local_92 & 1) != 0) {
      std::allocator<char>::~allocator(&local_91);
    }
    if ((local_132 & 1) != 0) {
      pEVar8 = server(this);
      local_98 = Client::GetRemoteAddr(&this->super_Client);
      EOServer::RecordClientRejection(pEVar8,&local_98,"bad packet");
      Client::Close(&this->super_Client,true);
      local_9c = 1;
      goto LAB_0015e0fb;
    }
  }
  PVar4 = PacketReader::Family((PacketReader *)local_40);
  if (PVar4 == PACKET_INTERNAL) {
    client_seq = (int)Client::GetRemoteAddr(&this->super_Client);
    IPAddress::operator_cast_to_string((string *)local_c0,(IPAddress *)&client_seq);
    std::__cxx11::string::c_str();
    Console::Wrn("Closing client connection sending a reserved packet ID: %s");
    std::__cxx11::string::~string((string *)local_c0);
    Client::Close(&this->super_Client,false);
    local_9c = 1;
  }
  else {
    PVar4 = PacketReader::Family((PacketReader *)local_40);
    if (PVar4 == PACKET_F_INIT) {
      GenSequence(this);
    }
    else {
      PVar4 = PacketReader::Family((PacketReader *)local_40);
      local_177 = false;
      if (PVar4 == PACKET_CONNECTION) {
        PVar3 = PacketReader::Action((PacketReader *)local_40);
        local_177 = PVar3 == PACKET_PING;
      }
      server_seq._3_1_ = local_177;
      if (local_177 != false) {
        PongNewSequence(this);
      }
      local_d0 = GenSequence(this);
      if ((int)local_d0 < 0xfd) {
        bVar5 = PacketReader::GetChar((PacketReader *)local_40);
        local_cc = (uint)bVar5;
      }
      else {
        uVar6 = PacketReader::GetShort((PacketReader *)local_40);
        local_cc = (uint)uVar6;
      }
      pEVar8 = server(this);
      pWVar1 = pEVar8->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"EnforceSequence",&local_f1);
      pmVar9 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[](&(pWVar1->config).
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ,&local_f0);
      bVar2 = util::variant::operator_cast_to_bool(pmVar9);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      if ((bVar2) && (local_cc != local_d0)) {
        if (((this->super_Client).accepted & 1U) == 0) {
          pEVar8 = server(this);
          local_120 = Client::GetRemoteAddr(&this->super_Client);
          EOServer::RecordClientRejection(pEVar8,&local_120,"bad sequence");
          Client::Close(&this->super_Client,true);
          local_9c = 1;
        }
        else {
          local_11c = Client::GetRemoteAddr(&this->super_Client);
          IPAddress::operator_cast_to_string(&local_118,&local_11c);
          uVar10 = std::__cxx11::string::c_str();
          Console::Wrn("Closing client connection sending invalid sequence: %s, Got %i, expected %i."
                       ,uVar10,(ulong)local_cc,(ulong)local_d0);
          std::__cxx11::string::~string((string *)&local_118);
          Client::Close(&this->super_Client,false);
          local_9c = 1;
        }
        goto LAB_0015e0fb;
      }
    }
    ActionQueue::AddAction(&this->queue,(PacketReader *)local_40,0.02,true);
    local_9c = 0;
  }
LAB_0015e0fb:
  PacketReader::~PacketReader((PacketReader *)local_40);
  return;
}

Assistant:

void EOClient::Execute(const std::string &data)
{
	if (data.length() < 2)
		return;

	if (!this->Connected())
		return;

	PacketReader reader(processor.Decode(data));

	if (!this->accepted)
	{
		PacketFamily family = reader.Family();

		if (family != PACKET_F_INIT && family != PACKET_CONNECTION
		 && !(family == PACKET_PLAYERS && reader.Action() == PACKET_LIST && this->server()->world->config["AllowStats"]))
		{
			this->server()->RecordClientRejection(this->GetRemoteAddr(), "bad packet");
			this->Close(true);
			return;
		}
	}

	if (reader.Family() == PACKET_INTERNAL)
	{
		Console::Wrn("Closing client connection sending a reserved packet ID: %s", static_cast<std::string>(this->GetRemoteAddr()).c_str());
		this->Close();
		return;
	}

	if (reader.Family() != PACKET_F_INIT)
	{
		bool ping_reply = (reader.Family() == PACKET_CONNECTION && reader.Action() == PACKET_PING);

		if (ping_reply)
			this->PongNewSequence();

		int client_seq;
		int server_seq = this->GenSequence();

		if (server_seq >= 253)
			client_seq = reader.GetShort();
		else
			client_seq = reader.GetChar();

		if (this->server()->world->config["EnforceSequence"])
		{
			if (client_seq != server_seq)
			{
				if (this->accepted)
				{
					Console::Wrn("Closing client connection sending invalid sequence: %s, Got %i, expected %i.", static_cast<std::string>(this->GetRemoteAddr()).c_str(), client_seq, server_seq);
					this->Close();
					return;
				}
				else
				{
					this->server()->RecordClientRejection(this->GetRemoteAddr(), "bad sequence");
					this->Close(true);
					return;
				}
			}
		}
	}
	else
	{
		this->GenSequence();
	}

	queue.AddAction(reader, 0.02, true);
}